

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  QTreeWidgetItem *pQVar1;
  ulong uVar2;
  int iVar3;
  SortOrder SVar4;
  QTreeView *pQVar5;
  QHeaderView *pQVar6;
  uint in_ECX;
  uint *puVar7;
  uint *in_R8;
  
  if (((__s[0x54] == '\0') && (*(int *)(__s + 0x50) != 0)) &&
     (*(long *)(*(long *)(__s + 8) + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar5 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar6 = QTreeView::header(pQVar5);
    iVar3 = QHeaderView::sortIndicatorSection(pQVar6);
    pQVar5 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar6 = QTreeView::header(pQVar5);
    SVar4 = QHeaderView::sortIndicatorOrder(pQVar6);
    (**(code **)(*(long *)__s + 0x140))(__s,iVar3,SVar4);
  }
  iVar3 = (**(code **)(*(long *)__s + 0x80))(__s);
  if ((-1 < (int)(in_ECX | __c)) && ((int)in_ECX < iVar3)) {
    puVar7 = in_R8 + 2;
    if (*(long *)(in_R8 + 4) == 0) {
      puVar7 = (uint *)(__s + 0x10);
    }
    if ((int)(in_R8[1] | *in_R8) < 0) {
      puVar7 = (uint *)(__s + 0x10);
    }
    pQVar1 = *(QTreeWidgetItem **)puVar7;
    if (((pQVar1 != (QTreeWidgetItem *)0x0) && (uVar2 = (pQVar1->children).d.size, __c < (int)uVar2)
        ) && ((-1 < __c && ((uint)__c < uVar2)))) {
      QTreeWidgetItem::executePendingSort(pQVar1);
      pQVar1 = (pQVar1->children).d.ptr[(uint)__c];
      if (pQVar1 != (QTreeWidgetItem *)0x0) {
        *(int *)this = __c;
        *(uint *)&this->field_0x4 = in_ECX;
        *(QTreeWidgetItem **)&this->field_0x8 = pQVar1;
        this->rootItem = (QTreeWidgetItem *)__s;
        return (char *)this;
      }
    }
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  this->rootItem = (QTreeWidgetItem *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex QTreeModel::index(int row, int column, const QModelIndex &parent) const
{
    executePendingSort();

    int c = columnCount(parent);
    if (row < 0 || column < 0 || column >= c)
        return QModelIndex();

    QTreeWidgetItem *parentItem = parent.isValid() ? item(parent) : rootItem;
    if (parentItem && row < parentItem->childCount()) {
        QTreeWidgetItem *itm = parentItem->child(row);
        if (itm)
            return createIndex(row, column, itm);
        return QModelIndex();
    }

    return QModelIndex();
}